

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O0

int ffpnul(fitsfile *fptr,LONGLONG nulvalue,int *status)

{
  int iVar1;
  int local_34 [2];
  int hdutype;
  tcolumn *colptr;
  int *status_local;
  LONGLONG nulvalue_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    colptr = (tcolumn *)status;
    status_local = (int *)nulvalue;
    nulvalue_local = (LONGLONG)fptr;
    iVar1 = ffghdt(fptr,local_34,status);
    if (iVar1 < 1) {
      if (local_34[0] == 0) {
        iVar1 = fits_is_compressed_image((fitsfile *)nulvalue_local,(int *)colptr);
        if (iVar1 == 0) {
          *(int **)(*(long *)(*(long *)(nulvalue_local + 8) + 0x3d0) + 0x110) = status_local;
          fptr_local._4_4_ = *(int *)colptr->ttype;
        }
        else {
          fptr_local._4_4_ = *(int *)colptr->ttype;
        }
      }
      else {
        colptr->ttype[0] = -0x17;
        colptr->ttype[1] = '\0';
        colptr->ttype[2] = '\0';
        colptr->ttype[3] = '\0';
        fptr_local._4_4_ = 0xe9;
      }
    }
    else {
      fptr_local._4_4_ = *(int *)colptr->ttype;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpnul(fitsfile *fptr,      /* I - FITS file pointer                */
           LONGLONG nulvalue,   /* I - null pixel value: value of BLANK */
           int *status)         /* IO - error status                    */
/*
  Define the value used to represent undefined pixels in the primary array or
  image extension. This only applies to integer image pixel (i.e. BITPIX > 0).
  This routine overrides the null pixel value given by the BLANK keyword
  if present.  Note that this routine does not write or modify the BLANK
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the BLANK  keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != IMAGE_HDU)
        return(*status = NOT_IMAGE);         /* not proper HDU type */

    if (fits_is_compressed_image(fptr, status)) /* ignore compressed images */
        return(*status);

    /* set pointer to the first 'column' (contains group parameters if any) */
    colptr = (fptr->Fptr)->tableptr; 

    colptr++;   /* increment to the 2nd 'column' pointer  (the image itself) */

    colptr->tnull = nulvalue;

    return(*status);
}